

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

void os_xlat_html4(uint html4_char,char *result,size_t result_buf_len)

{
  int iVar1;
  size_t sVar2;
  
  if (os_xlat_html4::mapper == '\0') {
    iVar1 = __cxa_guard_acquire(&os_xlat_html4::mapper);
    if (iVar1 != 0) {
      CCharmapToLocalASCII::CCharmapToLocalASCII(&os_xlat_html4::mapper);
      __cxa_atexit(CCharmapToLocal::~CCharmapToLocal,&os_xlat_html4::mapper,&__dso_handle);
      __cxa_guard_release(&os_xlat_html4::mapper);
    }
  }
  sVar2 = CCharmapToLocal::map_char
                    ((CCharmapToLocal *)&os_xlat_html4::mapper,html4_char,result,result_buf_len);
  result[sVar2] = '\0';
  return;
}

Assistant:

void
os_xlat_html4( unsigned int html4_char, char* result, size_t result_buf_len )
{
#ifdef RUNTIME
    // HTML 4 characters are Unicode.  Tads 3 provides just the
    // right mapper: Unicode to ASCII.  We make it static in order
    // not to create a mapper on each call and save CPU cycles.
    static CCharmapToLocalASCII mapper;
    result[mapper.map_char(html4_char, result, result_buf_len)] = '\0';
#else
    (void)html4_char;
    (void)result;
    (void)result_buf_len;
#endif
}